

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O1

int gdTransformAffineCopy
              (gdImagePtr dst,int dst_x,int dst_y,gdImagePtr src,gdRectPtr src_region,double *affine
              )

{
  gdInterpolationMethod gVar1;
  int *piVar2;
  uint uVar3;
  char cVar4;
  long lVar5;
  gdImagePtr im;
  int iVar6;
  long lVar7;
  int iVar8;
  gdInterpolationMethod id;
  undefined4 in_register_00000014;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  double dVar14;
  int backup_clipy2;
  int backup_clipx2;
  int backup_clipy1;
  int backup_clipx1;
  gdPointF src_pt;
  gdPointF pt;
  gdRect bbox;
  int c2y;
  int c2x;
  int c1y;
  int c1x;
  double inv [6];
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  ulong local_f8;
  long local_f0;
  ulong local_e8;
  double local_e0;
  gdImagePtr local_d8;
  long local_d0;
  double local_c8;
  double local_c0;
  undefined4 local_b4;
  gdPointF local_b0;
  gdPointF local_a0;
  gdRect local_90;
  ulong local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68 [14];
  
  local_e8 = CONCAT44(in_register_00000014,dst_y);
  local_f0 = CONCAT44(local_f0._4_4_,dst_x);
  gVar1 = src->interpolation_id;
  id = GD_DEFAULT;
  if (((gVar1 < GD_POWER) &&
      (id = GD_DEFAULT, (0x10028U >> (gVar1 & (GD_NEAREST_NEIGHBOUR|GD_MITCHELL)) & 1) != 0)) &&
     (id = gVar1, src != (gdImagePtr)0x0)) {
    src->interpolation = filter_bicubic;
    src->interpolation_id = GD_BICUBIC;
  }
  gdImageGetClip(src,local_68,(int *)&local_a0,(int *)&local_b0,&local_90.x);
  iVar6 = src_region->x;
  iVar8 = src_region->y;
  iVar11 = iVar6 + src_region->width + -1;
  iVar10 = iVar8 + src_region->height + -1;
  iVar12 = local_68[0];
  if (local_68[0] < iVar6) {
    iVar12 = iVar6;
  }
  if (local_b0.x._0_4_ < iVar6) {
    iVar12 = local_b0.x._0_4_;
  }
  src_region->x = iVar12;
  iVar6 = local_a0.x._0_4_;
  if (local_a0.x._0_4_ < iVar8) {
    iVar6 = iVar8;
  }
  if (local_90.x < iVar8) {
    iVar6 = local_90.x;
  }
  src_region->y = iVar6;
  if (local_68[0] < iVar11) {
    local_68[0] = iVar11;
  }
  if (local_b0.x._0_4_ < iVar11) {
    local_68[0] = local_b0.x._0_4_;
  }
  iVar11 = (local_68[0] - iVar12) + 1;
  iVar8 = local_a0.x._0_4_;
  if (local_a0.x._0_4_ < iVar10) {
    iVar8 = iVar10;
  }
  src_region->width = iVar11;
  if (local_90.x < iVar10) {
    iVar8 = local_90.x;
  }
  iVar8 = (iVar8 - iVar6) + 1;
  src_region->height = iVar8;
  if (((0 < iVar12) || (0 < iVar6)) ||
     ((iVar11 < src->sx ||
      (uVar9 = (undefined4)CONCAT71((int7)((ulong)&local_b0 >> 8),1), iVar8 < src->sy)))) {
    gdImageGetClip(src,&local_fc,&local_100,&local_104,&local_108);
    gdImageSetClip(src,src_region->x,src_region->y,src_region->x + src_region->width + -1,
                   src_region->y + -1 + src_region->height);
    uVar9 = 0;
  }
  iVar6 = gdTransformAffineBoundingBox(src_region,affine,&local_90);
  if (iVar6 == 0) {
    iVar6 = 0;
    cVar4 = (char)uVar9;
  }
  else {
    local_d8 = src;
    local_b4 = uVar9;
    gdImageGetClip(dst,&local_6c,&local_70,&local_74,&local_78);
    local_f8 = (ulong)(uint)local_90.width;
    iVar6 = -local_90.x;
    if (0 < local_90.x) {
      iVar6 = local_90.x;
    }
    local_80 = (ulong)(uint)local_90.height;
    uVar3 = -local_90.y;
    if (0 < local_90.y) {
      uVar3 = local_90.y;
    }
    iVar12 = uVar3 + local_90.height;
    gdAffineInvert((double *)local_68,affine);
    im = local_d8;
    iVar8 = (int)local_f8;
    if (dst->alphaBlendingFlag == 0) {
      if (-1 < iVar12) {
        local_e0 = (double)local_90.y;
        iVar10 = (int)local_f0;
        local_c0 = (double)src_region->x;
        local_c8 = (double)src_region->y;
        iVar12 = -local_90.x;
        if (0 < local_90.x) {
          iVar12 = local_90.x;
        }
        local_d0 = (long)(int)local_e8;
        uVar3 = -local_90.y;
        if (0 < local_90.y) {
          uVar3 = local_90.y;
        }
        local_e8 = (ulong)((int)local_80 + 1 + uVar3);
        uVar13 = 0;
        local_f0 = (long)(int)local_f0 << 2;
        do {
          lVar5 = local_f0;
          local_a0.y = (double)(int)uVar13 + 0.5 + local_e0;
          lVar7 = uVar13 + local_d0;
          if ((-1 < lVar7) && (lVar7 < dst->sy && -1 < iVar6 + local_90.width)) {
            piVar2 = dst->tpixels[lVar7];
            lVar7 = 0;
            do {
              local_a0.x = (double)(int)lVar7 + 0.5 + (double)local_90.x;
              gdAffineApplyToPointF(&local_b0,&local_a0,(double *)local_68);
              iVar11 = iVar10 + (int)lVar7;
              if ((iVar11 < 0) || (dst->sx <= iVar11)) break;
              iVar11 = getPixelInterpolated
                                 (im,(double)CONCAT44(local_b0.x._4_4_,local_b0.x._0_4_) + local_c0,
                                  local_b0.y + local_c8,-1);
              *(int *)((long)piVar2 + lVar7 * 4 + lVar5) = iVar11;
              lVar7 = lVar7 + 1;
            } while (iVar8 + iVar12 + 1 != (int)lVar7);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != local_e8);
      }
    }
    else if (local_90.y <= iVar12) {
      local_c0 = (double)src_region->x;
      local_c8 = (double)src_region->y;
      iVar10 = -local_90.x;
      if (0 < local_90.x) {
        iVar10 = local_90.x;
      }
      local_f8 = CONCAT44(local_f8._4_4_,iVar8 + 1 + iVar10);
      local_d0 = CONCAT44(local_d0._4_4_,iVar12);
      do {
        local_e0 = (double)(ulong)(uint)local_90.y;
        local_a0.y = (double)local_90.y + 0.5;
        if (-1 < iVar6 + local_90.width) {
          iVar8 = (int)local_e8;
          dVar14 = 0.0;
          iVar12 = (int)local_f0;
          iVar10 = (int)local_f8;
          do {
            local_a0.x = dVar14 + 0.5;
            gdAffineApplyToPointF(&local_b0,&local_a0,(double *)local_68);
            iVar11 = getPixelInterpolated
                               (local_d8,(double)CONCAT44(local_b0.x._4_4_,local_b0.x._0_4_) +
                                         local_c0,local_b0.y + local_c8,0);
            gdImageSetPixel(dst,iVar12,local_90.y + iVar8,iVar11);
            dVar14 = dVar14 + 1.0;
            iVar12 = iVar12 + 1;
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        local_90.y = SUB84(local_e0,0) + 1;
      } while (SUB84(local_e0,0) < (int)local_d0);
    }
    iVar6 = 1;
    src = local_d8;
    cVar4 = (char)local_b4;
  }
  if (cVar4 == '\0') {
    gdImageSetClip(src,local_fc,local_100,local_104,local_108);
  }
  gdImageSetInterpolationMethod(src,id);
  return iVar6;
}

Assistant:

BGD_DECLARE(int) gdTransformAffineCopy(gdImagePtr dst,
		  int dst_x, int dst_y,
		  const gdImagePtr src,
		  gdRectPtr src_region,
		  const double affine[6])
{
	int c1x,c1y,c2x,c2y;
	int backclip = 0;
	int backup_clipx1, backup_clipy1, backup_clipx2, backup_clipy2;
	register int x, y, src_offset_x, src_offset_y;
	double inv[6];
	int *dst_p;
	gdPointF pt, src_pt;
	gdRect bbox;
	int end_x, end_y;
	gdInterpolationMethod interpolation_id_bak = GD_DEFAULT;

	/* These methods use special implementations */
	if (src->interpolation_id == GD_BILINEAR_FIXED || src->interpolation_id == GD_BICUBIC_FIXED || src->interpolation_id == GD_NEAREST_NEIGHBOUR) {
		interpolation_id_bak = src->interpolation_id;
		
		gdImageSetInterpolationMethod(src, GD_BICUBIC);
	}


	gdImageClipRectangle(src, src_region);

	if (src_region->x > 0 || src_region->y > 0
		|| src_region->width < gdImageSX(src)
		|| src_region->height < gdImageSY(src)) {
		backclip = 1;

		gdImageGetClip(src, &backup_clipx1, &backup_clipy1,
		&backup_clipx2, &backup_clipy2);

		gdImageSetClip(src, src_region->x, src_region->y,
			src_region->x + src_region->width - 1,
			src_region->y + src_region->height - 1);
	}

	if (!gdTransformAffineBoundingBox(src_region, affine, &bbox)) {
		if (backclip) {
			gdImageSetClip(src, backup_clipx1, backup_clipy1,
					backup_clipx2, backup_clipy2);
		}
		gdImageSetInterpolationMethod(src, interpolation_id_bak);
		return GD_FALSE;
	}

	gdImageGetClip(dst, &c1x, &c1y, &c2x, &c2y);

	end_x = bbox.width  + abs(bbox.x);
	end_y = bbox.height + abs(bbox.y);

	/* Get inverse affine to let us work with destination -> source */
	gdAffineInvert(inv, affine);

	src_offset_x =  src_region->x;
	src_offset_y =  src_region->y;

	if (dst->alphaBlendingFlag) {
		for (y = bbox.y; y <= end_y; y++) {
			pt.y = y + 0.5;
			for (x = 0; x <= end_x; x++) {
				pt.x = x + 0.5;
				gdAffineApplyToPointF(&src_pt, &pt, inv);
				gdImageSetPixel(dst, dst_x + x, dst_y + y, getPixelInterpolated(src, src_offset_x + src_pt.x, src_offset_y + src_pt.y, 0));
			}
		}
	} else {
		for (y = 0; y <= end_y; y++) {
			pt.y = y + 0.5 + bbox.y;
			if ((dst_y + y) < 0 || ((dst_y + y) > gdImageSY(dst) -1)) {
				continue;
			}
			dst_p = dst->tpixels[dst_y + y] + dst_x;

			for (x = 0; x <= end_x; x++) {
				pt.x = x + 0.5 + bbox.x;
				gdAffineApplyToPointF(&src_pt, &pt, inv);

				if ((dst_x + x) < 0 || (dst_x + x) > (gdImageSX(dst) - 1)) {
					break;
				}
				*(dst_p++) = getPixelInterpolated(src, src_offset_x + src_pt.x, src_offset_y + src_pt.y, -1);
			}
		}
	}

	/* Restore clip if required */
	if (backclip) {
		gdImageSetClip(src, backup_clipx1, backup_clipy1,
				backup_clipx2, backup_clipy2);
	}

	gdImageSetInterpolationMethod(src, interpolation_id_bak);
	return GD_TRUE;
}